

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

uint mp_coprime(mp_int *a,mp_int *b)

{
  uint uVar1;
  mp_int *x;
  
  x = mp_gcd(a,b);
  uVar1 = mp_eq_integer(x,1);
  mp_free(x);
  return uVar1;
}

Assistant:

unsigned mp_coprime(mp_int *a, mp_int *b)
{
    mp_int *gcd = mp_gcd(a, b);
    unsigned toret = mp_eq_integer(gcd, 1);
    mp_free(gcd);
    return toret;
}